

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexthtmlparser.cpp
# Opt level: O2

void __thiscall QTextHtmlParser::parseCloseTag(QTextHtmlParser *this)

{
  uint uVar1;
  char16_t *pcVar2;
  char16_t *pcVar3;
  QTextHtmlParserNode **ppQVar4;
  QTextHtmlParserNode *pQVar5;
  bool bVar6;
  char cVar7;
  ulong uVar8;
  pointer ppQVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_78;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this->pos = this->pos + 1;
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  parseWord((QString *)&QStack_78,this);
  QString::toLower_helper((QString *)&local_60);
  QString::trimmed_helper((QString *)&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_78);
  iVar12 = this->pos;
  lVar10 = (long)iVar12;
  pcVar3 = (this->txt).d.ptr;
  do {
    iVar12 = iVar12 + 1;
    if (this->len <= lVar10) break;
    this->pos = iVar12;
    pcVar2 = pcVar3 + lVar10;
    lVar10 = lVar10 + 1;
  } while (*pcVar2 != L'>');
  iVar12 = (int)(this->nodes).d.size;
  uVar1 = iVar12 - 1;
  uVar11 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    uVar13 = (ulong)(iVar12 - 2);
    bVar6 = ::comparesEqual(&(this->nodes).d.ptr[uVar13]->tag,(QString *)&local_48);
    if (((bVar6) && (uVar8 = (ulong)(uint)(this->nodes).d.ptr[uVar13]->id, uVar8 < 0x39)) &&
       ((0x1000000e0000000U >> (uVar8 & 0x3f) & 1) != 0)) {
      uVar11 = uVar13;
    }
  }
  do {
    iVar12 = (int)uVar11;
    if (iVar12 == 0) {
LAB_00495730:
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return;
      }
      __stack_chk_fail();
    }
    bVar6 = ::operator!=(&(this->nodes).d.ptr[iVar12]->tag,(QString *)&local_48);
    ppQVar4 = (this->nodes).d.ptr;
    pQVar5 = ppQVar4[iVar12];
    if (!bVar6) {
      if ((((uint)pQVar5->wsm < 5) && ((0x1aU >> (pQVar5->wsm & 0x1f) & 1) != 0)) &&
         ((pQVar5->field_0x91 & 0xe) == 0)) {
        cVar7 = QString::endsWith((QChar)((short)*(undefined8 *)
                                                  ((long)ppQVar4 +
                                                  (((this->nodes).d.size << 0x20) + -0x100000000 >>
                                                  0x1d)) + L'\x18'),10);
        if (cVar7 != '\0') {
          lVar10 = (this->nodes).d.size;
          ppQVar9 = QList<QTextHtmlParserNode_*>::data(&this->nodes);
          QString::chop(*(long *)((long)ppQVar9 + ((lVar10 << 0x20) + -0x100000000 >> 0x1d)) + 0x18)
          ;
        }
      }
      newNode(this,(this->nodes).d.ptr[iVar12]->parent);
      resolveNode(this);
      goto LAB_00495730;
    }
    uVar11 = (ulong)(uint)pQVar5->parent;
  } while( true );
}

Assistant:

void QTextHtmlParser::parseCloseTag()
{
    ++pos;
    QString tag = parseWord().toLower().trimmed();
    while (pos < len) {
        QChar c = txt.at(pos++);
        if (c == u'>')
            break;
    }

    // find corresponding open node
    int p = last();
    if (p > 0
        && at(p - 1).tag == tag
        && at(p - 1).mayNotHaveChildren())
        p--;

    while (p && at(p).tag != tag)
        p = at(p).parent;

    // simply ignore the tag if we can't find
    // a corresponding open node, for broken
    // html such as <font>blah</font></font>
    if (!p)
        return;

    // in a white-space preserving environment strip off a trailing newline
    // since the closing of the opening block element will automatically result
    // in a new block for elements following the <pre>
    // ...foo\n</pre><p>blah -> foo</pre><p>blah
    if ((at(p).wsm == QTextHtmlParserNode::WhiteSpacePre
         || at(p).wsm == QTextHtmlParserNode::WhiteSpacePreWrap
         || at(p).wsm == QTextHtmlParserNode::WhiteSpacePreLine)
        && at(p).isBlock()) {
        if (at(last()).text.endsWith(u'\n'))
            nodes[last()]->text.chop(1);
    }

    newNode(at(p).parent);
    resolveNode();
}